

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O0

REF_STATUS ref_histogram_node_tec(REF_GRID ref_grid,REF_DBL *observations)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT node;
  REF_HISTOGRAM ref_histogram;
  REF_NODE ref_node;
  REF_DBL *observations_local;
  REF_GRID ref_grid_local;
  
  ref_histogram = (REF_HISTOGRAM)ref_grid->node;
  ref_node = (REF_NODE)observations;
  observations_local = (REF_DBL *)ref_grid;
  uVar1 = ref_histogram_create((REF_HISTOGRAM *)&ref_private_macro_code_rss);
  if (uVar1 == 0) {
    uVar1 = ref_histogram_resolution(_ref_private_macro_code_rss,0x120,12.0);
    if (uVar1 == 0) {
      for (ref_private_macro_code_rss_1 = 0;
          ref_private_macro_code_rss_1 < *(int *)((long)&ref_histogram->max + 4);
          ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
        if ((((-1 < ref_private_macro_code_rss_1) &&
             (ref_private_macro_code_rss_1 < *(int *)((long)&ref_histogram->max + 4))) &&
            (-1 < *(long *)((long)ref_histogram->log_total + (long)ref_private_macro_code_rss_1 * 8)
            )) && ((0.0 < *(double *)(&ref_node->n + (long)ref_private_macro_code_rss_1 * 2) &&
                   (uVar1 = ref_histogram_add(_ref_private_macro_code_rss,
                                              *(REF_DBL *)
                                               (&ref_node->n +
                                               (long)ref_private_macro_code_rss_1 * 2)), uVar1 != 0)
                   ))) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
                 ,0x24f,"ref_histogram_node_tec",(ulong)uVar1,"add");
          return uVar1;
        }
      }
      uVar1 = ref_histogram_gather(_ref_private_macro_code_rss,(REF_MPI)*observations_local);
      if (uVar1 == 0) {
        if ((*(int *)((long)*observations_local + 4) == 0) &&
           (uVar1 = ref_histogram_tec(_ref_private_macro_code_rss,"node"), uVar1 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
                 ,0x255,"ref_histogram_node_tec",(ulong)uVar1,"tec");
          ref_grid_local._4_4_ = uVar1;
        }
        else {
          ref_grid_local._4_4_ = ref_histogram_free(_ref_private_macro_code_rss);
          if (ref_grid_local._4_4_ == 0) {
            ref_grid_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
                   ,599,"ref_histogram_node_tec",(ulong)ref_grid_local._4_4_,"free gram");
          }
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
               ,0x252,"ref_histogram_node_tec",(ulong)uVar1,"gather");
        ref_grid_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
             0x24b,"ref_histogram_node_tec",(ulong)uVar1,"res");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
           0x24a,"ref_histogram_node_tec",(ulong)uVar1,"create");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_node_tec(REF_GRID ref_grid,
                                          REF_DBL *observations) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_HISTOGRAM ref_histogram;
  REF_INT node;

  RSS(ref_histogram_create(&ref_histogram), "create");
  RSS(ref_histogram_resolution(ref_histogram, 288, 12.0), "res");

  each_ref_node_valid_node(ref_node, node) {
    if (observations[node] > 0.0)
      RSS(ref_histogram_add(ref_histogram, observations[node]), "add");
  }

  RSS(ref_histogram_gather(ref_histogram, ref_grid_mpi(ref_grid)), "gather");

  if (ref_grid_once(ref_grid))
    RSS(ref_histogram_tec(ref_histogram, "node"), "tec");

  RSS(ref_histogram_free(ref_histogram), "free gram");
  return REF_SUCCESS;
}